

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varint.hpp
# Opt level: O0

int protozero::add_varint_to_buffer(char *data,uint64_t value)

{
  undefined4 local_1c;
  uint64_t uStack_18;
  int n;
  uint64_t value_local;
  char *data_local;
  
  local_1c = 1;
  value_local = (uint64_t)data;
  for (uStack_18 = value; 0x7f < uStack_18; uStack_18 = uStack_18 >> 7) {
    *(byte *)value_local = (byte)uStack_18 & 0x7f | 0x80;
    local_1c = local_1c + 1;
    value_local = value_local + 1;
  }
  *(byte *)value_local = (byte)uStack_18;
  return local_1c;
}

Assistant:

inline int add_varint_to_buffer(char* data, uint64_t value) noexcept {
    int n = 1;

    while (value >= 0x80U) {
        *data++ = static_cast<char>((value & 0x7fU) | 0x80U);
        value >>= 7U;
        ++n;
    }
    *data = static_cast<char>(value);

    return n;
}